

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

bool __thiscall
cmMakefileTargetGenerator::CheckUseResponseFileForLibraries
          (cmMakefileTargetGenerator *this,string *l)

{
  bool bVar1;
  char *val;
  string responseVar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"CMAKE_",l);
  std::operator+(&local_50,&local_30,"_USE_RESPONSE_FILE_FOR_LIBRARIES");
  std::__cxx11::string::~string((string *)&local_30);
  val = cmMakefile::GetDefinition((this->super_cmCommonTargetGenerator).Makefile,&local_50);
  if ((val == (char *)0x0) || (*val == '\0')) {
    bVar1 = false;
  }
  else {
    bVar1 = cmSystemTools::IsOn(val);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return bVar1;
}

Assistant:

bool cmMakefileTargetGenerator::CheckUseResponseFileForLibraries(
  std::string const& l) const
{
  // Check for an explicit setting one way or the other.
  std::string const responseVar =
    "CMAKE_" + l + "_USE_RESPONSE_FILE_FOR_LIBRARIES";
  if (const char* val = this->Makefile->GetDefinition(responseVar)) {
    if (*val) {
      return cmSystemTools::IsOn(val);
    }
  }

  // We do not need a response file for libraries.
  return false;
}